

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ManEvalWindowInc
              (Gia_Man_t *p,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,Vec_Wec_t *vWin,Vec_Int_t *vTemp,
              int fUseTwo)

{
  int iVar1;
  int iVar2;
  int local_44;
  int DelayMax;
  int Delay;
  int iLut;
  int i;
  int fUseTwo_local;
  Vec_Int_t *vTemp_local;
  Vec_Wec_t *vWin_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vLeaves_local;
  Gia_Man_t *p_local;
  
  local_44 = 0;
  iVar1 = Vec_IntSize(vNodes);
  iVar2 = Vec_WecSize(vWin);
  if (iVar1 == iVar2) {
    Gia_ManUpdateMapping(p,vNodes,vWin);
    Gia_ManCollectTfo(p,vLeaves,vTemp);
    Vec_IntReverseOrder(vTemp);
    for (Delay = 0; iVar1 = Vec_IntSize(vTemp), Delay < iVar1; Delay = Delay + 1) {
      iVar1 = Vec_IntEntry(vTemp,Delay);
      iVar2 = Gia_ObjIsLut(p,iVar1);
      if (iVar2 != 0) {
        iVar1 = Gia_ObjComputeEdgeDelay(p,iVar1,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
        local_44 = Abc_MaxInt(local_44,iVar1);
      }
    }
    Gia_ManUpdateMapping(p,vNodes,vWin);
    return local_44;
  }
  __assert_fail("Vec_IntSize(vNodes) == Vec_WecSize(vWin)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                ,0x26b,
                "int Gia_ManEvalWindowInc(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, int)"
               );
}

Assistant:

int Gia_ManEvalWindowInc( Gia_Man_t * p, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Wec_t * vWin, Vec_Int_t * vTemp, int fUseTwo )
{
    int i, iLut, Delay, DelayMax = 0;
    assert( Vec_IntSize(vNodes) == Vec_WecSize(vWin) );
    Gia_ManUpdateMapping( p, vNodes, vWin );
    Gia_ManCollectTfo( p, vLeaves, vTemp );
    Vec_IntReverseOrder( vTemp );
    Vec_IntForEachEntry( vTemp, iLut, i )
    {
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        Delay = Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    Gia_ManUpdateMapping( p, vNodes, vWin );
    return DelayMax;
}